

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

string * __thiscall agr::savebuf::str_abi_cxx11_(string *__return_storage_ptr__,savebuf *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->save);
  return __return_storage_ptr__;
}

Assistant:

std::string savebuf::str() const 
   { 
    return save; 
   }